

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O3

void __thiscall
xLearn::DMATRIX_TEST_Serialize_and_Deserialize_Test::TestBody
          (DMATRIX_TEST_Serialize_and_Deserialize_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  bool bVar3;
  index_t row_id;
  size_t i;
  long lVar4;
  char *pcVar5;
  pointer expected;
  AssertionResult gtest_ar;
  DMatrix matrix;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  string local_c0;
  AssertHelper local_a0;
  DMatrix local_98;
  
  local_98.pos = 0;
  local_98.hash_value_1 = 0;
  local_98.hash_value_2 = 0;
  local_98.row_length = 0;
  local_98.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_98.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_98.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = SUB648(ZEXT464(0) << 0x40,7);
  local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.has_label = false;
  DMatrix::Reset(&local_98);
  lVar4 = 0;
  do {
    DMatrix::AddRow(&local_98);
    row_id = (index_t)lVar4;
    DMatrix::AddNode(&local_98,row_id,row_id,2.5,row_id);
    local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = (float)lVar4;
    local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = 0.25;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  paVar1 = &local_c0.field_2;
  local_98.hash_value_1 = 0x4d2;
  local_98.hash_value_2 = 0x162e;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/tmp/test.bin","");
  DMatrix::Serialize(&local_98,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  DMatrix::Reset(&local_98);
  local_d0.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_c0,"matrix.has_label","true",&local_98.has_label,(bool *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x62,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_c0,"matrix.hash_value_1","0",&local_98.hash_value_1,(int *)&local_d0
            );
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_c0,"matrix.hash_value_2","0",&local_98.hash_value_2,(int *)&local_d0
            );
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_c0,"matrix.row_length","0",&local_98.row_length,(int *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_ = local_d0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_c0,"matrix.pos","0",&local_98.pos,(int *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_1_ = 1;
  local_d0.ptr_._0_1_ =
       local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_c0,"matrix.Y.empty()","true",(bool *)&local_d0,(bool *)&local_c8);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_1_ = 1;
  local_d0.ptr_._0_1_ =
       local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_c0,"matrix.norm.empty()","true",(bool *)&local_d0,(bool *)&local_c8)
  ;
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x68,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8.data_._0_1_ = 1;
  local_d0.ptr_._0_1_ =
       local_98.row.
       super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pointer)CONCAT71(local_98.row.
                         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                         local_98.row.
                         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_c0,"matrix.row.empty()","true",(bool *)&local_d0,(bool *)&local_c8);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x69,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/tmp/test.bin","");
  DMatrix::Deserialize(&local_98,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_c0,"matrix.row_length","kLength",&local_98.row_length,&kLength);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x70,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_._0_4_ = 0x4d2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_c0,"matrix.hash_value_1","1234",&local_98.hash_value_1,
             (int *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x71,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_._0_4_ = 0x162e;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_c0,"matrix.hash_value_2","5678",&local_98.hash_value_2,
             (int *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x72,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_c0,"matrix.has_label","true",&local_98.has_label,(bool *)&local_d0);
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x73,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (((local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    testing::internal::CmpHelperEQ<float,unsigned_long>
              ((internal *)&local_c0,"matrix.Y[i]","i",
               local_98.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (long)local_d0.ptr_,(unsigned_long *)&local_d0);
    if ((char)local_c0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      pcVar5 = "";
      if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
        pcVar5 = *(char **)local_c0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0x75,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (((local_c8.data_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_c8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_c8.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_c0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c8.data_ = (AssertHelperData *)&DAT_3fd0000000000000;
    testing::internal::CmpHelperEQ<float,double>
              ((internal *)&local_c0,"matrix.norm[i]","0.25",
               local_98.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + (long)local_d0.ptr_,(double *)&local_c8);
    if ((char)local_c0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c8);
      pcVar5 = "";
      if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
        pcVar5 = *(char **)local_c0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0x76,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (((local_c8.data_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_c8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_c8.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_c0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar2 = local_98.row.
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)local_d0.ptr_];
    expected = (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
    if (expected !=
        (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&local_c0,"iter->field_id","i",&expected->field_id,
                   (unsigned_long *)&local_d0);
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c8);
          pcVar5 = "";
          if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
            pcVar5 = *(char **)local_c0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                     ,0x7a,pcVar5);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (((local_c8.data_ != (AssertHelperData *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&local_c0,"iter->feat_id","i",&expected->feat_id,
                   (unsigned_long *)&local_d0);
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c8);
          pcVar5 = "";
          if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
            pcVar5 = *(char **)local_c0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                     ,0x7b,pcVar5);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (((local_c8.data_ != (AssertHelperData *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&local_c0,"iter->feat_val","2.5",expected->feat_val,2.5);
        if ((char)local_c0._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_c8);
          pcVar5 = "";
          if ((undefined8 *)local_c0._M_string_length != (undefined8 *)0x0) {
            pcVar5 = *(char **)local_c0._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                     ,0x7c,pcVar5);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (((local_c8.data_ != (AssertHelperData *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_c8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        expected = expected + 1;
      } while (expected !=
               (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_d0.ptr_ = local_d0.ptr_ + 1;
  } while (local_d0.ptr_ <
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa);
  RemoveFile("/tmp/test.bin");
  DMatrix::~DMatrix(&local_98);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Serialize_and_Deserialize) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  // Serialize
#ifndef _MSC_VER
  matrix.Serialize("/tmp/test.bin");
#else
  matrix.Serialize("../../test.bin");
#endif
  matrix.Reset();
  EXPECT_EQ(matrix.has_label, true);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, 0);
  EXPECT_EQ(matrix.pos, 0);
  EXPECT_EQ(matrix.Y.empty(), true);
  EXPECT_EQ(matrix.norm.empty(), true);
  EXPECT_EQ(matrix.row.empty(),true);
  // Deserialize
#ifndef _MSC_VER
  matrix.Deserialize("/tmp/test.bin");
#else
  matrix.Deserialize("../../test.bin");
#endif
  EXPECT_EQ(matrix.row_length, kLength);
  EXPECT_EQ(matrix.hash_value_1, 1234);
  EXPECT_EQ(matrix.hash_value_2, 5678);
  EXPECT_EQ(matrix.has_label, true);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(matrix.Y[i], i);
    EXPECT_EQ(matrix.norm[i], 0.25);
    SparseRow *row = matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, i);
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 2.5);
    }
  }
#ifndef _MSC_VER
  RemoveFile("/tmp/test.bin");
#else
  RemoveFile("../../test.bin");
#endif
}